

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O1

void Gia_ManCheckUnateVecTest(Gia_Man_t *p,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Wec_t *__ptr;
  void *pvVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  Vec_Int_t *pVVar10;
  ulong uVar11;
  timespec ts;
  long local_58;
  timespec local_50;
  ulong local_40;
  size_t local_38;
  
  iVar4 = clock_gettime(3,&local_50);
  if (iVar4 < 0) {
    local_58 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_58 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  uVar9 = 0;
  __ptr = Gia_ManCheckUnateVec(p,(Vec_Int_t *)0x0,(Vec_Int_t *)0x0);
  iVar4 = p->vCis->nSize;
  local_38 = (size_t)iVar4;
  pvVar5 = calloc(local_38 + 1,1);
  if (fVerbose != 0) {
    printf("Inputs  : ");
    if (0 < iVar4) {
      uVar11 = 0;
      do {
        printf("%d",(ulong)(uint)((int)uVar11 + (int)(uVar11 / 10) * -10));
        uVar11 = (ulong)((int)uVar11 + 1);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    putchar(10);
  }
  pVVar10 = p->vCos;
  iVar4 = 0;
  if (0 < pVVar10->nSize) {
    uVar9 = __ptr->nSize;
    if (__ptr->nSize < 1) {
      uVar9 = 0;
    }
    local_40 = (ulong)uVar9;
    uVar11 = 0;
    iVar4 = 0;
    uVar9 = 0;
    do {
      if (uVar11 == local_40) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar10 = __ptr->pArray;
      memset(pvVar5,0x20,local_38);
      iVar8 = pVVar10[uVar11].nSize;
      if (0 < iVar8) {
        uVar6 = 0;
        do {
          if ((int)uVar6 < 0) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar2 = pVVar10[uVar11].pArray[uVar6];
          uVar1 = uVar6 + 1;
          if ((int)uVar1 < iVar8) {
            if (((int)uVar2 < 0) || (uVar3 = pVVar10[uVar11].pArray[uVar1], (int)uVar3 < 0)) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            if (uVar2 >> 1 != uVar3 >> 1) goto LAB_007dee2c;
            *(undefined1 *)((long)pvVar5 + (ulong)(uVar2 >> 1)) = 0x2e;
            iVar4 = iVar4 + 1;
            uVar6 = uVar1;
          }
          else {
LAB_007dee2c:
            if ((int)uVar2 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            *(char *)((long)pvVar5 + (ulong)(uVar2 >> 1)) = ((uVar2 & 1) == 0) * '\x02' + 'n';
            uVar9 = uVar9 + 1;
          }
          uVar6 = uVar6 + 1;
          iVar8 = pVVar10[uVar11].nSize;
        } while ((int)uVar6 < iVar8);
      }
      if (fVerbose != 0) {
        printf("Out%4d : %s\n",uVar11 & 0xffffffff,pvVar5);
      }
      uVar11 = uVar11 + 1;
      pVVar10 = p->vCos;
    } while ((long)uVar11 < (long)pVVar10->nSize);
  }
  if (pvVar5 != (void *)0x0) {
    free(pvVar5);
  }
  iVar8 = 0x997dfa;
  printf("Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",(ulong)(uint)p->vCis->nSize,
         (ulong)(uint)pVVar10->nSize,(ulong)(iVar4 + uVar9),(ulong)uVar9);
  Abc_Print(iVar8,"%s =","Total time");
  iVar8 = 3;
  iVar4 = clock_gettime(3,&local_50);
  if (iVar4 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar7 + local_58) / 1000000.0);
  iVar4 = __ptr->nCap;
  if (0 < (long)iVar4) {
    pVVar10 = __ptr->pArray;
    lVar7 = 0;
    do {
      pvVar5 = *(void **)((long)&pVVar10->pArray + lVar7);
      if (pvVar5 != (void *)0x0) {
        free(pvVar5);
        *(undefined8 *)((long)&pVVar10->pArray + lVar7) = 0;
      }
      lVar7 = lVar7 + 0x10;
    } while ((long)iVar4 * 0x10 != lVar7);
  }
  if (__ptr->pArray != (Vec_Int_t *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (Vec_Int_t *)0x0;
  }
  __ptr->nCap = 0;
  __ptr->nSize = 0;
  free(__ptr);
  return;
}

Assistant:

void Gia_ManCheckUnateVecTest( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Vec_Wec_t * vUnates = Gia_ManCheckUnateVec( p, NULL, NULL );
    int i, o, Var, nVars = Gia_ManCiNum(p);
    int nUnate = 0, nNonUnate = 0;
    char * pBuffer = ABC_CALLOC( char, nVars+1 );
    if ( fVerbose )
    {
        printf( "Inputs  : " );
        for ( i = 0; i < nVars; i++ )
            printf( "%d", i % 10 );
        printf( "\n" );
    }
    for ( o = 0; o < Gia_ManCoNum(p); o++ )
    {
        Vec_Int_t * vUnate = Vec_WecEntry( vUnates, o );
        memset( pBuffer, ' ', (size_t)nVars );
        Vec_IntForEachEntry( vUnate, Var, i )
            if ( i+1 < Vec_IntSize(vUnate) && Abc_Lit2Var(Var) == Abc_Lit2Var(Vec_IntEntry(vUnate, i+1)) ) // both lits are present
                pBuffer[Abc_Lit2Var(Var)] = '.', i++, nNonUnate++; // does not depend on this var
            else
                pBuffer[Abc_Lit2Var(Var)] = Abc_LitIsCompl(Var) ? 'n' : 'p', nUnate++;
        if ( fVerbose )
            printf( "Out%4d : %s\n", o, pBuffer );
    }
    ABC_FREE( pBuffer );
    // print stats
    printf( "Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",
        Gia_ManCiNum(p), Gia_ManCoNum(p), nUnate+nNonUnate, nUnate );
    ABC_PRT( "Total time", Abc_Clock() - clk );
    //Vec_WecPrint( vUnates, 0 );
    Vec_WecFree( vUnates );
}